

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

Vec_Ptr_t *
Aig_ManRegProjectOnehots(Aig_Man_t *pAig,Aig_Man_t *pPart,Vec_Ptr_t *vOnehots,int fVerbose)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar4;
  Vec_Int_t *p_00;
  int iVar5;
  int i;
  int i_00;
  Vec_Ptr_t *local_50;
  
  for (iVar5 = 0; iVar5 < pPart->vCis->nSize; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(pPart->vCis,iVar5);
    *(int *)((long)pvVar3 + 0x28) = iVar5;
  }
  iVar5 = pAig->nObjs[2];
  iVar1 = pAig->nRegs;
  local_50 = (Vec_Ptr_t *)0x0;
  for (i = 0; i < vOnehots->nSize; i = i + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vOnehots,i);
    p_00 = (Vec_Int_t *)0x0;
    for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
      iVar2 = Vec_IntEntry(p,i_00);
      pAVar4 = Aig_ManCi(pAig,iVar2 + (iVar5 - iVar1));
      if (pAVar4->TravId == pAig->nTravIds) {
        if (p_00 == (Vec_Int_t *)0x0) {
          p_00 = Vec_IntAlloc(p->nSize);
        }
        Vec_IntPush(p_00,*(int *)((long)(pAVar4->field_5).pData + 0x28));
      }
    }
    if (p_00 != (Vec_Int_t *)0x0) {
      if (p_00->nSize < 2) {
        Vec_IntFree(p_00);
      }
      else {
        if (local_50 == (Vec_Ptr_t *)0x0) {
          local_50 = Vec_PtrAlloc(100);
        }
        Vec_PtrPush(local_50,p_00);
      }
    }
  }
  for (iVar5 = 0; iVar5 < pPart->vCis->nSize; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(pPart->vCis,iVar5);
    *(undefined4 *)((long)pvVar3 + 0x28) = 0;
  }
  if (fVerbose != 0 && local_50 != (Vec_Ptr_t *)0x0) {
    printf("Partition contains %d groups of 1-hot registers: { ",(ulong)(uint)local_50->nSize);
    for (iVar5 = 0; iVar5 < local_50->nSize; iVar5 = iVar5 + 1) {
      pvVar3 = Vec_PtrEntry(local_50,iVar5);
      printf("%d ",(ulong)*(uint *)((long)pvVar3 + 4));
    }
    puts("}");
  }
  return local_50;
}

Assistant:

Vec_Ptr_t * Aig_ManRegProjectOnehots( Aig_Man_t * pAig, Aig_Man_t * pPart, Vec_Ptr_t * vOnehots, int fVerbose )
{
    Vec_Ptr_t * vOnehotsPart = NULL;
    Vec_Int_t * vGroup, * vGroupNew;
    Aig_Obj_t * pObj, * pObjNew;
    int nOffset, iReg, i, k;
    // set the PI numbers
    Aig_ManForEachCi( pPart, pObj, i )
        pObj->iData = i;
    // go through each group and check if registers are involved in this one
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vGroup, i )
    {
        vGroupNew = NULL;
        Vec_IntForEachEntry( vGroup, iReg, k )
        {
            pObj = Aig_ManCi( pAig, nOffset+iReg );
            if ( !Aig_ObjIsTravIdCurrent(pAig, pObj) )
                continue;
            if ( vGroupNew == NULL )
                vGroupNew = Vec_IntAlloc( Vec_IntSize(vGroup) );
            pObjNew = (Aig_Obj_t *)pObj->pData;
            Vec_IntPush( vGroupNew, pObjNew->iData );
        }
        if ( vGroupNew == NULL )
            continue;
        if ( Vec_IntSize(vGroupNew) > 1 )
        {
            if ( vOnehotsPart == NULL )
                vOnehotsPart = Vec_PtrAlloc( 100 );
            Vec_PtrPush( vOnehotsPart, vGroupNew );
        }
        else
            Vec_IntFree( vGroupNew );
    }
    // clear the PI numbers
    Aig_ManForEachCi( pPart, pObj, i )
        pObj->iData = 0;
    // print out
    if ( vOnehotsPart && fVerbose )
    {
        printf( "Partition contains %d groups of 1-hot registers: { ", Vec_PtrSize(vOnehotsPart) );
        Vec_PtrForEachEntry( Vec_Int_t *, vOnehotsPart, vGroup, k )
            printf( "%d ", Vec_IntSize(vGroup) );
        printf( "}\n" );
    }
    return vOnehotsPart;
}